

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_address_get_host_ip(ENetAddress *address,char *name,size_t nameLength)

{
  char *pcVar1;
  socklen_t in_EDX;
  char *in_RSI;
  void *in_RDI;
  undefined4 local_4;
  
  pcVar1 = inet_ntop(2,in_RDI,in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_address_get_host_ip (const ENetAddress * address, char * name, size_t nameLength)
{
#ifdef HAS_INET_NTOP
    if (inet_ntop (AF_INET, & address -> host, name, nameLength) == NULL)
#else
    char * addr = inet_ntoa (* (struct in_addr *) & address -> host);
    if (addr != NULL)
    {
        size_t addrLen = strlen(addr);
        if (addrLen >= nameLength)
          return -1;
        memcpy (name, addr, addrLen + 1);
    } 
    else
#endif
        return -1;
    return 0;
}